

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void text_search_list(t_text_search *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  t_key_conflict *ptVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  _binbuf *x_00;
  t_atom *ptVar8;
  word *pwVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  t_atom *ptVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  t_float tVar25;
  float fVar26;
  float fVar27;
  int local_7c;
  
  x_00 = text_client_getbuf(&x->x_tc);
  if (x_00 == (_binbuf *)0x0) {
    return;
  }
  uVar1 = x->x_nkeys;
  if (argc < (int)uVar1) {
    pd_error(x,"need %d keys, only got %d in list",(ulong)uVar1,(ulong)(uint)argc);
  }
  ptVar8 = binbuf_getvec(x_00);
  uVar6 = binbuf_getnatom(x_00);
  if ((int)uVar1 < 1) {
    bug("text_search");
  }
  if ((int)uVar6 < 1) {
    tVar25 = -1.0;
  }
  else {
    local_7c = -1;
    uVar12 = 0;
    iVar14 = 0;
    iVar18 = -1;
    bVar4 = false;
    iVar7 = 0;
    do {
      if (uVar12 == uVar6 - 1 || (ptVar8[uVar12].a_type & ~A_FLOAT) == A_SEMI) {
        iVar3 = local_7c;
        iVar17 = iVar18;
        if (iVar14 < x->x_onset) {
LAB_0018e51b:
          local_7c = iVar3;
          iVar14 = iVar14 + 1;
          iVar7 = (int)uVar12 + 1;
          bVar23 = true;
          iVar18 = iVar17;
        }
        else {
          if (iVar14 < x->x_onset + x->x_range) {
            iVar21 = (int)uVar12 - iVar7;
            ptVar2 = x->x_keyvec;
            iVar13 = ptVar2->k_field;
            iVar10 = ptVar2->k_binop;
            if (0 < argc) {
              pwVar9 = &argv->a_w;
              uVar11 = 1;
              iVar16 = iVar13;
              iVar15 = iVar10;
              do {
                if (iVar21 <= iVar16) goto LAB_0018e51b;
                iVar19 = iVar7 + iVar16;
                if (ptVar8[iVar19].a_type != ((t_atom *)(pwVar9 + -1))->a_type) goto LAB_0018e51b;
                if ((float)((t_atom *)(pwVar9 + -1))->a_type != 1.4013e-45) {
                  if (iVar15 == 0) {
                    if (ptVar8[iVar19].a_w.w_symbol == pwVar9->w_symbol)
                    goto switchD_0018e207_default;
                  }
                  else {
                    bVar23 = !bVar4;
                    bVar4 = true;
                    if (bVar23) {
                      pd_error(x,"text search (%s): only exact matches allowed for symbols",
                               pwVar9->w_symbol->s_name);
                    }
                  }
                  goto LAB_0018e51b;
                }
                switch(iVar15) {
                case 0:
                  if ((ptVar8[iVar19].a_w.w_float != pwVar9->w_float) ||
                     (NAN(ptVar8[iVar19].a_w.w_float) || NAN(pwVar9->w_float))) goto LAB_0018e51b;
                  break;
                case 1:
                  bVar23 = pwVar9->w_float < ptVar8[iVar19].a_w.w_float;
                  goto LAB_0018e26d;
                case 2:
                  bVar23 = pwVar9->w_float == ptVar8[iVar19].a_w.w_float;
                  bVar22 = pwVar9->w_float < ptVar8[iVar19].a_w.w_float;
                  goto LAB_0018e24e;
                case 3:
                  bVar23 = ptVar8[iVar19].a_w.w_float < pwVar9->w_float;
LAB_0018e26d:
                  if (!bVar23) goto LAB_0018e51b;
                  break;
                case 4:
                  bVar23 = ptVar8[iVar19].a_w.w_float == pwVar9->w_float;
                  bVar22 = ptVar8[iVar19].a_w.w_float < pwVar9->w_float;
LAB_0018e24e:
                  if (!bVar22 && !bVar23) goto LAB_0018e51b;
                }
switchD_0018e207_default:
                if ((long)uVar11 < (long)(int)uVar1) {
                  iVar16 = ptVar2[uVar11].k_field;
                  iVar15 = ptVar2[uVar11].k_binop;
                }
                else {
                  iVar16 = iVar16 + 1;
                }
                pwVar9 = pwVar9 + 2;
                bVar23 = uVar11 != (uint)argc;
                uVar11 = uVar11 + 1;
              } while (bVar23);
            }
            if (-1 >= local_7c) {
              iVar3 = iVar14;
              iVar17 = iVar7;
            }
            if (-1 < local_7c && 0 < argc) {
              uVar11 = 1;
              ptVar20 = argv;
              do {
                if ((iVar21 <= iVar13) || (ptVar8[iVar7 + iVar13].a_type != ptVar20->a_type)) {
                  bug("text search 2");
                }
                if (ptVar20->a_type == A_FLOAT) {
                  tVar25 = -1e+20;
                  if (-1 < iVar18) {
                    tVar25 = ptVar8[iVar13 + iVar18].a_w.w_float;
                  }
                  fVar26 = ptVar8[iVar7 + iVar13].a_w.w_float;
                  if (iVar10 - 1U < 2) {
LAB_0018e3c6:
                    cVar5 = '\f';
                    if ((tVar25 <= fVar26) && (cVar5 = '\x05', fVar26 <= tVar25)) goto LAB_0018e3da;
                  }
                  else if (iVar10 - 3U < 2) {
LAB_0018e39b:
                    cVar5 = '\f';
                    if ((fVar26 <= tVar25) && (cVar5 = '\x05', tVar25 <= fVar26)) {
LAB_0018e3da:
                      cVar5 = '\0';
                    }
                  }
                  else {
                    if (iVar10 != 5) goto LAB_0018e3da;
                    fVar24 = (ptVar20->a_w).w_float;
                    if ((fVar24 <= fVar26) && (fVar24 <= tVar25)) goto LAB_0018e3c6;
                    if ((fVar26 <= fVar24) && (tVar25 <= fVar24)) goto LAB_0018e39b;
                    fVar26 = fVar26 - fVar24;
                    fVar24 = tVar25 - fVar24;
                    fVar27 = -fVar26;
                    if (-fVar26 <= fVar26) {
                      fVar27 = fVar26;
                    }
                    fVar26 = -fVar24;
                    if (-fVar24 <= fVar24) {
                      fVar26 = fVar24;
                    }
                    if (fVar26 <= fVar27) {
                      cVar5 = (fVar26 < fVar27) * '\x05';
                    }
                    else {
                      cVar5 = '\f';
                    }
                    if (fVar27 == fVar26) goto LAB_0018e3da;
                  }
                  if (cVar5 != '\0') {
                    iVar3 = local_7c;
                    iVar17 = iVar18;
                    if ((cVar5 != '\x05') && (iVar3 = iVar14, iVar17 = iVar7, cVar5 != '\f'))
                    goto LAB_0018e4a8;
                    break;
                  }
                }
                if ((long)uVar11 < (long)(int)uVar1) {
                  iVar13 = x->x_keyvec[uVar11].k_field;
                  iVar10 = x->x_keyvec[uVar11].k_binop;
                }
                else {
                  iVar13 = iVar13 + 1;
                }
                ptVar20 = ptVar20 + 1;
                bVar23 = uVar11 != (uint)argc;
                uVar11 = uVar11 + 1;
                iVar3 = local_7c;
                iVar17 = iVar18;
              } while (bVar23);
            }
            goto LAB_0018e51b;
          }
LAB_0018e4a8:
          bVar23 = false;
        }
        if (!bVar23) break;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
    tVar25 = (t_float)local_7c;
  }
  outlet_float(x->x_out1,tVar25);
  return;
}

Assistant:

static void text_search_list(t_text_search *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int i, n, lineno, bestline = -1, beststart=-1, bestn, thisstart,
        nkeys = x->x_nkeys, failed = 0;
    t_atom *vec;
    if (!b)
       return;
    if (argc < nkeys)
    {
        pd_error(x, "need %d keys, only got %d in list",
            nkeys, argc);
    }
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (nkeys < 1)
        bug("text_search");
    for (i = lineno = thisstart = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA || i == n-1)
        {
            int thisn, j, field, binop;
            if (lineno < x->x_onset)
                goto nomatch;
            if (lineno >= x->x_onset + x->x_range)
                break;
            thisn = i - thisstart;
            field = x->x_keyvec[0].k_field;
            binop = x->x_keyvec[0].k_binop;
                /* do we match? */
            for (j = 0; j < argc; )
            {
                if (field >= thisn ||
                    vec[thisstart+field].a_type != argv[j].a_type)
                        goto nomatch;
                if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                {
                    switch (binop)
                    {
                        case KB_EQ:
                            if (vec[thisstart+field].a_w.w_float !=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GT:
                            if (vec[thisstart+field].a_w.w_float <=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GE:
                            if (vec[thisstart+field].a_w.w_float <
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LT:
                            if (vec[thisstart+field].a_w.w_float >=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LE:
                            if (vec[thisstart+field].a_w.w_float >
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                            /* the other possibility ('near') never fails */
                    }
                }
                else                                /* arg is a symbol */
                {
                    if (binop != KB_EQ)
                    {
                        if (!failed)
                        {
                            pd_error(x,
                    "text search (%s): only exact matches allowed for symbols",
                                argv[j].a_w.w_symbol->s_name);
                            failed = 1;
                        }
                        goto nomatch;
                    }
                    if (vec[thisstart+field].a_w.w_symbol !=
                        argv[j].a_w.w_symbol)
                            goto nomatch;
                }
                if (++j >= nkeys)    /* if at last key just increment field */
                    field++;
                else field = x->x_keyvec[j].k_field,    /* else next key */
                        binop = x->x_keyvec[j].k_binop;
            }
                /* the line matches.  Now, if there is a previous match, are
                we better than it? */
            if (bestline >= 0)
            {
                field = x->x_keyvec[0].k_field;
                binop = x->x_keyvec[0].k_binop;
                for (j = 0; j < argc; )
                {
                    if (field >= thisn
                        || vec[thisstart+field].a_type != argv[j].a_type)
                            bug("text search 2");
                    if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                    {
                        float thisv = vec[thisstart+field].a_w.w_float,
                            bestv = (beststart >= 0 ?
                                vec[beststart+field].a_w.w_float : -1e20);
                        switch (binop)
                        {
                            case KB_GT:
                            case KB_GE:
                                if (thisv < bestv)
                                    goto replace;
                                else if (thisv > bestv)
                                    goto nomatch;
                            break;
                            case KB_LT:
                            case KB_LE:
                                if (thisv > bestv)
                                    goto replace;
                                else if (thisv < bestv)
                                    goto nomatch;
                            break;
                            case KB_NEAR:
                                if (thisv >= argv[j].a_w.w_float &&
                                    bestv >= argv[j].a_w.w_float)
                                {
                                    if (thisv < bestv)
                                        goto replace;
                                    else if (thisv > bestv)
                                        goto nomatch;
                                }
                                else if (thisv <= argv[j].a_w.w_float &&
                                    bestv <= argv[j].a_w.w_float)
                                {
                                    if (thisv > bestv)
                                        goto replace;
                                    else if (thisv < bestv)
                                        goto nomatch;
                                }
                                else
                                {
                                    float d1 = thisv - argv[j].a_w.w_float,
                                        d2 = bestv - argv[j].a_w.w_float;
                                    if (d1 < 0)
                                        d1 = -d1;
                                    if (d2 < 0)
                                        d2 = -d2;

                                    if (d1 < d2)
                                        goto replace;
                                    else if (d1 > d2)
                                        goto nomatch;
                                }
                            break;
                                /* the other possibility ('=') never decides */
                        }
                    }
                    if (++j >= nkeys)    /* last key - increment field */
                        field++;
                    else field = x->x_keyvec[j].k_field,    /* else next key */
                            binop = x->x_keyvec[j].k_binop;
                }
                goto nomatch;   /* a tie - keep the old one */
            replace:
                bestline = lineno, beststart = thisstart, bestn = thisn;
            }
                /* no previous match so we're best */
            else bestline = lineno, beststart = thisstart, bestn = thisn;
        nomatch:
            lineno++;
            thisstart = i+1;
        }
    }
    outlet_float(x->x_out1, bestline);
}